

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_snap_functions.cc
# Opt level: O2

void __thiscall
s2builderutil::IntLatLngSnapFunction::set_exponent(IntLatLngSnapFunction *this,int exponent)

{
  bool bVar1;
  S1Angle snap_radius;
  double dVar2;
  S2LogMessage local_20;
  
  if (exponent < 0) {
    S2LogMessage::S2LogMessage
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_snap_functions.cc"
               ,0xda,kFatal,(ostream *)&std::cerr);
    std::operator<<(local_20.stream_,"Check failed: (exponent) >= (kMinExponent) ");
  }
  else {
    if ((uint)exponent < 0xb) {
      this->exponent_ = exponent;
      snap_radius = MinSnapRadiusForExponent(exponent);
      set_snap_radius(this,snap_radius);
      dVar2 = 1.0;
      while (bVar1 = exponent != 0, exponent = exponent + -1, bVar1) {
        dVar2 = dVar2 * 10.0;
      }
      this->from_degrees_ = dVar2;
      this->to_degrees_ = 1.0 / dVar2;
      return;
    }
    S2LogMessage::S2LogMessage
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_snap_functions.cc"
               ,0xdb,kFatal,(ostream *)&std::cerr);
    std::operator<<(local_20.stream_,"Check failed: (exponent) <= (kMaxExponent) ");
  }
  abort();
}

Assistant:

void IntLatLngSnapFunction::set_exponent(int exponent) {
  S2_DCHECK_GE(exponent, kMinExponent);
  S2_DCHECK_LE(exponent, kMaxExponent);
  exponent_ = exponent;
  set_snap_radius(MinSnapRadiusForExponent(exponent));

  // Precompute the scale factors needed for snapping.  Note that these
  // calculations need to exactly match the ones in s1angle.h to ensure
  // that the same S2Points are generated.
  double power = 1;
  for (int i = 0; i < exponent; ++i) power *= 10;
  from_degrees_ = power;
  to_degrees_ = 1 / power;
}